

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O1

QString * __thiscall
QUrlQuery::query(QString *__return_storage_ptr__,QUrlQuery *this,ComponentFormattingOptions encoding
                )

{
  ArrayOptions *pAVar1;
  undefined2 ch;
  uint uVar2;
  QUrlQueryPrivate *pQVar3;
  pair<QString,_QString> *ppVar4;
  long lVar5;
  Data *pDVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  pair<QString,_QString> *input;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->d).d.ptr;
  if (pQVar3 == (QUrlQueryPrivate *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00268d17;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    uVar2._0_2_ = pQVar3->valueDelimiter;
    uVar2._2_2_ = pQVar3->pairDelimiter;
    auVar11 = pshuflw(ZEXT416(uVar2),ZEXT416(uVar2),0xe1);
    uVar2 = auVar11._0_4_ | (uint)DAT_004de0f0;
    local_40 = (ulong)uVar2;
    if (((uint)encoding.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
               super_QFlagsStorage<QUrl::ComponentFormattingOption>.i & 0xc00000) != 0) {
      local_40 = (ulong)CONCAT24(0x223,uVar2);
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    ppVar4 = (pQVar3->itemList).d.ptr;
    lVar5 = (pQVar3->itemList).d.size;
    if (lVar5 == 0) {
      iVar8 = 0;
    }
    else {
      lVar10 = 0;
      iVar8 = 0;
      do {
        iVar8 = iVar8 + *(int *)((long)&(ppVar4->first).d.size + lVar10) +
                        *(int *)((long)&(ppVar4->second).d.size + lVar10) + 2;
        lVar10 = lVar10 + 0x30;
      } while (lVar5 * 0x30 != lVar10);
    }
    iVar9 = iVar8 + 3;
    if (-1 < iVar8) {
      iVar9 = iVar8;
    }
    lVar10 = (long)((iVar9 >> 2) + iVar8);
    pDVar6 = (__return_storage_ptr__->d).d;
    if (((pDVar6 == (Data *)0x0) ||
        (1 < (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((pDVar6->super_QArrayData).alloc -
        ((long)((long)(__return_storage_ptr__->d).ptr -
               ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1)
        <= lVar10)) {
      lVar7 = (__return_storage_ptr__->d).size;
      if (lVar10 < lVar7) {
        lVar10 = lVar7;
      }
      QString::reallocData(__return_storage_ptr__,lVar10,KeepSize);
    }
    pDVar6 = (__return_storage_ptr__->d).d;
    if ((pDVar6 != (Data *)0x0) && ((pDVar6->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar6->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    input = (((this->d).d.ptr)->itemList).d.ptr;
    if (input != ppVar4 + lVar5) {
      do {
        if ((__return_storage_ptr__->d).size != 0) {
          QString::append(__return_storage_ptr__,(QChar)(((this->d).d.ptr)->pairDelimiter).ucs);
        }
        recodeAndAppend(__return_storage_ptr__,&input->first,encoding,(ushort *)&local_40);
        if ((input->second).d.ptr != (char16_t *)0x0) {
          ch = ((this->d).d.ptr)->valueDelimiter;
          QString::append(__return_storage_ptr__,(QChar)ch);
          recodeAndAppend(__return_storage_ptr__,&input->second,encoding,(ushort *)&local_40);
        }
        input = input + 1;
      } while (input != ppVar4 + lVar5);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00268d17:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QUrlQuery::query(QUrl::ComponentFormattingOptions encoding) const
{
    if (!d)
        return QString();

    // unlike the component encoding, for the whole query we need to modify a little:
    //  - the "#" character is unambiguous, so we encode it in EncodeDelimiters mode
    //  - the query delimiter pair must always be encoded

    // start with what's always encoded
    ushort tableActions[] = {
        encode(d->pairDelimiter.unicode()),  // 0
        encode(d->valueDelimiter.unicode()), // 1
        0,                                   // 2
        0
    };
    if (encoding & QUrl::EncodeDelimiters) {
        tableActions[2] = encode('#');
    }

    QString result;
    Map::const_iterator it = d->itemList.constBegin();
    Map::const_iterator end = d->itemList.constEnd();

    {
        int size = 0;
        for ( ; it != end; ++it)
            size += it->first.size() + 1 + it->second.size() + 1;
        result.reserve(size + size / 4);
    }

    for (it = d->itemList.constBegin(); it != end; ++it) {
        if (!result.isEmpty())
            result += QChar(d->pairDelimiter);
        recodeAndAppend(result, it->first, encoding, tableActions);
        if (!it->second.isNull()) {
            result += QChar(d->valueDelimiter);
            recodeAndAppend(result, it->second, encoding, tableActions);
        }
    }
    return result;
}